

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpClient.cpp
# Opt level: O2

void xmrig::ClientWriteBaton::onWrite(uv_write_t *req,int param_2)

{
  ClientWriteBaton *this;
  
  this = (ClientWriteBaton *)req->data;
  if (this != (ClientWriteBaton *)0x0) {
    ~ClientWriteBaton(this);
  }
  operator_delete(this);
  return;
}

Assistant:

inline static void onWrite(uv_write_t *req, int) { delete reinterpret_cast<ClientWriteBaton *>(req->data); }